

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

token * parse_for_statement(dmr_C *C,token *token,statement *stmt)

{
  position pVar1;
  symbol_list *psVar2;
  token *ptVar3;
  symbol *psVar4;
  statement *psVar5;
  expression *local_58;
  expression *e2;
  expression *e3;
  statement *iterator;
  symbol_list *syms;
  expression *e1;
  
  start_iterator(C,stmt);
  ptVar3 = dmrC_expect_token(C,token->next,0x28,"after \'for\'");
  iterator = (statement *)0x0;
  syms = (symbol_list *)0x0;
  if (((ulong)ptVar3->pos & 0x3f) == 2) {
    psVar4 = dmrC_lookup_symbol((ptVar3->field_2).ident,NS_SYMBOL|NS_TYPEDEF);
    if ((psVar4 != (symbol *)0x0) && ((psVar4->field_0x1 & 2) != 0)) {
      ptVar3 = dmrC_external_declaration(C,ptVar3,(symbol_list **)&iterator,validate_for_loop_decl);
      goto LAB_0011ba3a;
    }
  }
  ptVar3 = dmrC_parse_expression(C,ptVar3,(expression **)&syms);
  ptVar3 = dmrC_expect_token(C,ptVar3,0x3b,"in \'for\'");
LAB_0011ba3a:
  ptVar3 = dmrC_parse_expression(C,ptVar3,&local_58);
  ptVar3 = dmrC_expect_token(C,ptVar3,0x3b,"in \'for\'");
  ptVar3 = dmrC_parse_expression(C,ptVar3,&e2);
  ptVar3 = dmrC_expect_token(C,ptVar3,0x29,"in \'for\'");
  ptVar3 = statement(C,ptVar3,(statement **)&e3);
  psVar2 = syms;
  (stmt->field_2).field_3.if_false = iterator;
  if (syms == (symbol_list *)0x0) {
    psVar5 = (statement *)0x0;
  }
  else {
    pVar1 = (position)syms->prev_;
    psVar5 = (statement *)dmrC_allocator_allocate(&C->statement_allocator,0);
    psVar5->type = STMT_EXPRESSION;
    psVar5->pos = pVar1;
    (psVar5->field_2).field_1.expression = (expression *)psVar2;
  }
  (stmt->field_2).field_4.args = psVar5;
  (stmt->field_2).field_8.iterator_pre_condition = local_58;
  if (e2 == (expression *)0x0) {
    psVar5 = (statement *)0x0;
  }
  else {
    pVar1 = e2->pos;
    psVar5 = (statement *)dmrC_allocator_allocate(&C->statement_allocator,0);
    psVar5->type = STMT_EXPRESSION;
    psVar5->pos = pVar1;
    (psVar5->field_2).field_1.expression = e2;
  }
  (stmt->field_2).field_8.iterator_post_statement = psVar5;
  (stmt->field_2).field_8.iterator_post_condition = (expression *)0x0;
  (stmt->field_2).field_8.iterator_statement = (statement *)e3;
  dmrC_end_symbol_scope(C);
  return ptVar3;
}

Assistant:

static struct token *parse_for_statement(struct dmr_C *C, struct token *token, struct statement *stmt)
{
	struct symbol_list *syms;
	struct expression *e1, *e2, *e3;
	struct statement *iterator;

	start_iterator(C, stmt);
	token = dmrC_expect_token(C, token->next, '(', "after 'for'");

	syms = NULL;
	e1 = NULL;
	/* C99 variable declaration? */
	if (dmrC_lookup_type(token)) {
		token = dmrC_external_declaration(C, token, &syms, validate_for_loop_decl);
	} else {
		token = dmrC_parse_expression(C, token, &e1);
		token = dmrC_expect_token(C, token, ';', "in 'for'");
	}
	token = dmrC_parse_expression(C, token, &e2);
	token = dmrC_expect_token(C, token, ';', "in 'for'");
	token = dmrC_parse_expression(C, token, &e3);
	token = dmrC_expect_token(C, token, ')', "in 'for'");
	token = statement(C, token, &iterator);

	stmt->iterator_syms = syms;
	stmt->iterator_pre_statement = make_statement(C, e1);
	stmt->iterator_pre_condition = e2;
	stmt->iterator_post_statement = make_statement(C, e3);
	stmt->iterator_post_condition = NULL;
	stmt->iterator_statement = iterator;
	end_iterator(C, stmt);

	return token;
}